

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,string *settingsFileName,string *fallbackSettingsFileName)

{
  pointer pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  bool bVar5;
  cmLocalGenerator *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  PositionType PVar9;
  cmState *pcVar10;
  pointer pBVar11;
  RegularExpression currentRegex;
  string inFileName;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator ggi;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [192];
  string local_1208;
  undefined1 local_11e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11c8;
  undefined1 local_11a8 [2024];
  cmake local_9c0;
  cmGlobalGenerator local_638;
  
  cmake::cmake(&local_9c0,RoleScript,Unknown);
  pcVar1 = local_11a8 + 0x10;
  local_11a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"");
  cmake::SetHomeDirectory(&local_9c0,(string *)local_11a8);
  if ((pointer)local_11a8._0_8_ != pcVar1) {
    operator_delete((void *)local_11a8._0_8_,local_11a8._16_8_ + 1);
  }
  local_11a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"");
  cmake::SetHomeOutputDirectory(&local_9c0,(string *)local_11a8);
  if ((pointer)local_11a8._0_8_ != pcVar1) {
    operator_delete((void *)local_11a8._0_8_,local_11a8._16_8_ + 1);
  }
  local_11a8._16_8_ = local_9c0.CurrentSnapshot.Position.Position;
  local_11a8._0_8_ = local_9c0.CurrentSnapshot.State;
  local_11a8._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_11a8);
  cmGlobalGenerator::cmGlobalGenerator(&local_638,&local_9c0);
  local_12c8._0_8_ = local_9c0.CurrentSnapshot.Position.Position;
  local_12d8._0_8_ = local_9c0.CurrentSnapshot.State;
  local_12d8._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_11a8,&local_638,(cmStateSnapshot *)local_12d8);
  pcVar6 = cmGlobalGenerator::CreateLocalGenerator(&local_638,(cmMakefile *)local_11a8);
  local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  pcVar1 = (settingsFileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_12c8 + 0xc0),pcVar1,pcVar1 + settingsFileName->_M_string_length);
  bVar5 = cmsys::SystemTools::FileExists((string *)(local_12c8 + 0xc0));
  if (!bVar5) {
    std::__cxx11::string::_M_assign((string *)(local_12c8 + 0xc0));
    bVar5 = cmsys::SystemTools::FileExists((string *)(local_12c8 + 0xc0));
    if (!bVar5) goto LAB_00337a13;
  }
  bVar5 = cmMakefile::ReadListFile((cmMakefile *)local_11a8,(string *)(local_12c8 + 0xc0));
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1208._M_dataplus._M_p,
                        local_1208._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_GRAPH_TYPE","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphType)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar8);
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_GRAPH_NAME","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphName)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphName,0,pcVar2,(ulong)pcVar8);
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_GRAPH_HEADER","")
    ;
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphHeader)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphHeader,0,pcVar2,(ulong)pcVar8);
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_NODE_PREFIX","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphNodePrefix)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphNodePrefix,0,pcVar2,(ulong)pcVar8);
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_EXECUTABLES","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_EXECUTABLES","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForExecutables = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_STATIC_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_STATIC_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForStaticLibs = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_SHARED_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_SHARED_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForSharedLibs = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_MODULE_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_MODULE_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForModuleLibs = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_INTERFACE","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_12d8,"GRAPHVIZ_INTERFACE","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForInterface = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_12d8,"GRAPHVIZ_EXTERNAL_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_EXTERNAL_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateForExternals = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_12d8,"GRAPHVIZ_GENERATE_PER_TARGET","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_GENERATE_PER_TARGET","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GeneratePerTarget = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_12d8,"GRAPHVIZ_GENERATE_DEPENDERS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_12d8._0_8_ = (cmState *)local_12c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12d8,"GRAPHVIZ_GENERATE_DEPENDERS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_11a8,(string *)local_12d8);
      this->GenerateDependers = bVar5;
      if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
        operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
      }
    }
    local_11e8._0_8_ = local_11e8 + 0x10;
    local_11e8._8_8_ =
         (__uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
          )0x0;
    local_11e8[0x10] = '\0';
    local_12d8._0_8_ = (cmState *)local_12c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_12d8,"GRAPHVIZ_IGNORE_TARGETS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_12d8);
    if ((cmState *)local_12d8._0_8_ != (cmState *)local_12c8) {
      operator_delete((void *)local_12d8._0_8_,local_12c8._0_8_ + 1);
    }
    uVar3 = local_11e8._8_8_;
    if (pcVar8 != (char *)0x0) {
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)local_11e8,0,(char *)uVar3,(ulong)pcVar8);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if ((cmGlobVerificationManager *)local_11e8._8_8_ != (cmGlobVerificationManager *)0x0) {
      local_11c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_11c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_11c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument((string *)local_11e8,&local_11c8,false);
      pbVar4 = local_11c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_11c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_11c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar11 = (pointer)local_11c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_12d8._0_8_ = (cmState *)0x0;
          local_12c8._64_8_ = (pointer)0x0;
          local_12c8._144_8_ = (_Base_ptr)0x0;
          local_12c8._176_8_ = (char *)0x0;
          bVar5 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_12d8,(char *)(pBVar11->DirectoryEnd).Tree);
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)(pBVar11->DirectoryEnd).Tree,
                                (pBVar11->DirectoryEnd).Position);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>
                    (&this->TargetsToIgnoreRegex,(RegularExpression *)local_12d8);
          if ((char *)local_12c8._176_8_ != (char *)0x0) {
            operator_delete__((void *)local_12c8._176_8_);
          }
          pBVar11 = (pointer)&(pBVar11->Location).field_2;
        } while (pBVar11 != (pointer)pbVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_11c8);
    }
    if ((cmState *)local_11e8._0_8_ == (cmState *)(local_11e8 + 0x10)) goto LAB_00337a13;
    PVar9 = CONCAT71(local_11e8._17_7_,local_11e8[0x10]);
    pcVar10 = (cmState *)local_11e8._0_8_;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12d8,
                   "Problem opening GraphViz options file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_12c8 + 0xc0));
    cmSystemTools::Error((string *)local_12d8);
    PVar9 = local_12c8._0_8_;
    pcVar10 = (cmState *)local_12d8._0_8_;
    if ((cmState *)local_12d8._0_8_ == (cmState *)local_12c8) goto LAB_00337a13;
  }
  operator_delete(pcVar10,PVar9 + 1);
LAB_00337a13:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    operator_delete(local_1208._M_dataplus._M_p,local_1208.field_2._M_allocated_capacity + 1);
  }
  if (pcVar6 != (cmLocalGenerator *)0x0) {
    (*pcVar6->_vptr_cmLocalGenerator[1])(pcVar6);
  }
  cmMakefile::~cmMakefile((cmMakefile *)local_11a8);
  cmGlobalGenerator::~cmGlobalGenerator(&local_638);
  cmake::~cmake(&local_9c0);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(
  const std::string& settingsFileName,
  const std::string& fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  std::string inFileName = settingsFileName;
  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: " +
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  } while (false)

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = mf.IsOn(cmakeDefinition);                                       \
    }                                                                         \
  } while (false)

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForInterface, "GRAPHVIZ_INTERFACE");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}